

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis_weighted<double,long,std::vector<double,std::allocator<double>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
                 long *Xc_indptr,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  long lVar1;
  pointer pdVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  ulong *puVar12;
  long lVar13;
  ulong *puVar14;
  longdouble in_ST0;
  longdouble lVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  longdouble in_ST1;
  longdouble lVar21;
  longdouble local_100;
  long local_78;
  ushort uStack_70;
  long local_68;
  ushort uStack_60;
  
  lVar13 = Xc_indptr[col_num];
  lVar1 = Xc_indptr[col_num + 1];
  if (lVar13 != lVar1) {
    lVar15 = (longdouble)0;
    if (st <= end) {
      lVar15 = (longdouble)0;
      sVar4 = st;
      do {
        lVar15 = lVar15 + (longdouble)
                          (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[ix_arr[sVar4]];
        sVar4 = sVar4 + 1;
      } while (sVar4 <= end);
    }
    if ((longdouble)0 < lVar15) {
      puVar11 = ix_arr + st;
      puVar10 = ix_arr + end + 1;
      uVar5 = (long)puVar10 - (long)puVar11 >> 3;
      if (0 < (long)uVar5) {
        do {
          uVar6 = uVar5 >> 1;
          uVar9 = ~uVar6 + uVar5;
          uVar5 = uVar6;
          if (puVar11[uVar6] < (ulong)Xc_ind[lVar13]) {
            puVar11 = puVar11 + uVar6 + 1;
            uVar5 = uVar9;
          }
        } while (0 < (long)uVar5);
      }
      uVar5 = Xc_ind[lVar1 + -1];
      if (missing_action == Fail) {
        lVar18 = (longdouble)0;
        lVar16 = lVar18;
        lVar17 = lVar18;
        local_100 = lVar18;
        if (lVar13 != lVar1 && puVar11 != puVar10) {
          lVar17 = (longdouble)0;
          lVar16 = lVar17;
          lVar18 = lVar17;
          local_100 = lVar17;
          while (uVar6 = *puVar11, uVar6 <= uVar5) {
            puVar14 = (ulong *)(Xc_ind + lVar13);
            uVar9 = *puVar14;
            lVar19 = in_ST1;
            if (uVar9 == uVar6) {
              lVar16 = in_ST1;
              lVar17 = in_ST1;
              lVar20 = in_ST1;
              fmal();
              fmal();
              fmal();
              fmal();
              lVar18 = in_ST0;
              local_100 = in_ST1;
              if ((puVar11 == ix_arr + end) || (lVar13 == lVar1 + -1)) break;
              puVar14 = puVar14 + 1;
              puVar11 = puVar11 + 1;
              uVar6 = (long)Xc_ind + (lVar1 * 8 - (long)puVar14) >> 3;
              if (0 < (long)uVar6) {
                do {
                  uVar9 = uVar6 >> 1;
                  uVar7 = ~uVar9 + uVar6;
                  uVar6 = uVar9;
                  if (puVar14[uVar9] < *puVar11) {
                    puVar14 = puVar14 + uVar9 + 1;
                    uVar6 = uVar7;
                  }
                } while (0 < (long)uVar6);
              }
              lVar13 = (long)puVar14 - (long)Xc_ind >> 3;
              in_ST0 = lVar20;
            }
            else if ((long)uVar6 < (long)uVar9) {
              puVar11 = puVar11 + 1;
              uVar6 = (long)puVar10 - (long)puVar11 >> 3;
              while (0 < (long)uVar6) {
                uVar7 = uVar6 >> 1;
                uVar8 = ~uVar7 + uVar6;
                uVar6 = uVar7;
                if (puVar11[uVar7] < uVar9) {
                  puVar11 = puVar11 + uVar7 + 1;
                  uVar6 = uVar8;
                }
              }
            }
            else {
              puVar12 = puVar14 + 1;
              uVar9 = (long)Xc_ind + (lVar1 * 8 - (long)(puVar14 + 1)) >> 3;
              while (0 < (long)uVar9) {
                uVar7 = uVar9 >> 1;
                uVar8 = ~uVar7 + uVar9;
                uVar9 = uVar7;
                if (puVar12[uVar7] < uVar6) {
                  puVar12 = puVar12 + uVar7 + 1;
                  uVar9 = uVar8;
                }
              }
              lVar13 = (long)puVar12 - (long)Xc_ind >> 3;
            }
            if ((puVar11 == puVar10) || (in_ST1 = lVar19, lVar13 == lVar1)) break;
          }
        }
      }
      else {
        lVar16 = (longdouble)0;
        lVar17 = lVar16;
        lVar18 = lVar16;
        local_100 = lVar16;
        if (lVar13 != lVar1 && puVar11 != puVar10) {
          pdVar2 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar16 = (longdouble)0;
          lVar17 = lVar16;
          lVar18 = lVar16;
          local_100 = lVar16;
          while (uVar6 = *puVar11, uVar6 <= uVar5) {
            puVar14 = (ulong *)(Xc_ind + lVar13);
            uVar9 = *puVar14;
            if (uVar9 == uVar6) {
              lVar19 = (longdouble)Xc[lVar13];
              local_68 = SUB108(lVar19,0);
              uStack_60 = (ushort)((unkuint10)lVar19 >> 0x40);
              if ((NAN(Xc[lVar13])) ||
                 ((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000)) {
                lVar15 = lVar15 - (longdouble)pdVar2[uVar6];
              }
              else {
                lVar16 = in_ST0;
                local_100 = in_ST0;
                lVar17 = in_ST0;
                lVar19 = in_ST0;
                fmal();
                fmal();
                fmal();
                fmal();
                lVar18 = in_ST0;
                in_ST0 = lVar19;
              }
              if ((puVar11 == ix_arr + end) || (lVar13 == lVar1 + -1)) break;
              puVar12 = puVar14 + 1;
              puVar11 = puVar11 + 1;
              uVar6 = (long)Xc_ind + (lVar1 * 8 - (long)puVar12) >> 3;
              if (0 < (long)uVar6) {
                do {
                  uVar9 = uVar6 >> 1;
                  uVar7 = ~uVar9 + uVar6;
                  uVar6 = uVar9;
                  if (puVar12[uVar9] < *puVar11) {
                    puVar12 = puVar12 + uVar9 + 1;
                    uVar6 = uVar7;
                  }
                } while (0 < (long)uVar6);
              }
LAB_0012f0e4:
              lVar13 = (long)puVar12 - (long)Xc_ind >> 3;
            }
            else {
              if ((long)uVar9 <= (long)uVar6) {
                puVar12 = puVar14 + 1;
                uVar9 = (long)Xc_ind + (lVar1 * 8 - (long)(puVar14 + 1)) >> 3;
                while (0 < (long)uVar9) {
                  uVar7 = uVar9 >> 1;
                  uVar8 = ~uVar7 + uVar9;
                  uVar9 = uVar7;
                  if (puVar12[uVar7] < uVar6) {
                    puVar12 = puVar12 + uVar7 + 1;
                    uVar9 = uVar8;
                  }
                }
                goto LAB_0012f0e4;
              }
              puVar11 = puVar11 + 1;
              uVar6 = (long)puVar10 - (long)puVar11 >> 3;
              while (0 < (long)uVar6) {
                uVar7 = uVar6 >> 1;
                uVar8 = ~uVar7 + uVar6;
                uVar6 = uVar7;
                if (puVar11[uVar7] < uVar9) {
                  puVar11 = puVar11 + uVar7 + 1;
                  uVar6 = uVar8;
                }
              }
            }
            if ((puVar11 == puVar10) || (lVar13 == lVar1)) break;
          }
        }
        if (lVar15 <= (longdouble)0) {
          return -INFINITY;
        }
      }
      if ((longdouble)1 < lVar15) {
        if ((lVar16 != (longdouble)0) || (NAN(lVar16) || NAN((longdouble)0))) {
          if ((lVar16 != lVar18 * lVar18) || (NAN(lVar16) || NAN(lVar18 * lVar18))) {
            lVar19 = lVar18 / lVar15;
            lVar20 = lVar19 * lVar19;
            lVar21 = lVar16 / lVar15 - lVar20;
            if ((!NAN(lVar21)) &&
               (((longdouble)2.220446e-16 < lVar21 ||
                (bVar3 = check_more_than_two_unique_values<double,long>
                                   (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), bVar3
                )))) {
              if (lVar21 <= (longdouble)0) {
                return 0.0;
              }
              lVar15 = (lVar19 * lVar20 * lVar19 * lVar15 +
                       lVar18 * (longdouble)-4.0 * lVar20 * lVar19 +
                       lVar16 * (longdouble)6.0 * lVar20 +
                       lVar17 + local_100 * (longdouble)-4.0 * lVar19) / (lVar21 * lVar21 * lVar15);
              local_78 = SUB108(lVar15,0);
              uStack_70 = (ushort)((unkuint10)lVar15 >> 0x40);
              if (((unkuint10)lVar15 & 0x7fff) == 0 ||
                  (ushort)((uStack_70 & 0x7fff) - 1) < 0x7ffe && local_78 < 0) {
                if ((double)lVar15 <= 0.0) {
                  return 0.0;
                }
                return (double)lVar15;
              }
              return -INFINITY;
            }
          }
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}